

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

void adt_u32List_destroy(adt_u32List_t *self)

{
  adt_u32List_elem_tag *paVar1;
  adt_u32List_elem_t *pNext;
  adt_u32List_elem_t *iter;
  adt_u32List_t *self_local;
  
  if ((self != (adt_u32List_t *)0x0) && (pNext = self->pFirst, pNext != (adt_u32List_elem_t *)0x0))
  {
    while (pNext != (adt_u32List_elem_t *)0x0) {
      paVar1 = pNext->pNext;
      adt_u32List_elem_delete(pNext);
      pNext = paVar1;
    }
  }
  return;
}

Assistant:

void  adt_u32List_destroy(adt_u32List_t *self)
{
   if (self != 0)
   {
      adt_u32List_elem_t *iter = self->pFirst;
      if (iter == 0)
      {
         return; //empty list
      }
      while( iter != 0 )
      {
         adt_u32List_elem_t *pNext = iter->pNext;
         adt_u32List_elem_delete(iter);
         iter=pNext;
      }
   }
}